

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

size_type __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::size(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
       *this)

{
  undefined1 local_28 [16];
  pointer_type local_18;
  size_type s;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
  *this_local;
  
  s = (size_type)this;
  validate_pointer_invariants(this);
  local_18 = (pointer_type)0x0;
  cbegin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
          *)(local_28 + 8));
  cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
        *)local_28);
  std::
  for_each<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,iffl::flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::allocator<_FLAT_FORWARD_LIST_TEST>>::size()const::_lambda(_FLAT_FORWARD_LIST_TEST_const&)_1_>
            ((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)(local_28 + 8),
             (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)local_28,(anon_class_8_1_54a39813)&local_18);
  return (size_type)local_18;
}

Assistant:

size_type size() const noexcept {
        validate_pointer_invariants();
        size_type s = 0;
        std::for_each(cbegin(), cend(), [&s](T const &) noexcept {
            ++s;
        });
        return s;
    }